

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O2

char * cubeb_strings_intern(cubeb_strings *strings,char *s)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  char **__ptr;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if (s == (char *)0x0 || strings == (cubeb_strings *)0x0) {
    return (char *)0x0;
  }
  __ptr = strings->data;
  uVar7 = strings->count;
  uVar4 = (ulong)uVar7;
  lVar8 = 0;
  while( true ) {
    if (uVar4 * 8 - lVar8 == 0) {
      if (uVar7 == strings->size) {
        if (uVar7 * 2 + 0xe0000000 < 0xe0000001) {
          return (char *)0x0;
        }
        if (strings->small_store == __ptr) {
          __ptr = (char **)malloc((ulong)(uVar7 << 4));
          if (__ptr == (char **)0x0) {
            return (char *)0x0;
          }
          pcVar5 = strings->small_store[0];
          pcVar1 = strings->small_store[1];
          pcVar2 = strings->small_store[3];
          __ptr[2] = strings->small_store[2];
          __ptr[3] = pcVar2;
          *__ptr = pcVar5;
          __ptr[1] = pcVar1;
          uVar6 = uVar7;
        }
        else {
          __ptr = (char **)realloc(__ptr,(ulong)(uVar7 << 4));
          if (__ptr == (char **)0x0) {
            return (char *)0x0;
          }
          uVar4 = (ulong)strings->count;
          uVar6 = strings->count;
        }
        strings->size = uVar7 * 2;
        strings->data = __ptr;
        uVar7 = uVar6;
      }
      pcVar5 = strdup(s);
      strings->count = uVar7 + 1;
      __ptr[uVar4] = pcVar5;
      return pcVar5;
    }
    pcVar5 = *(char **)((long)__ptr + lVar8);
    if ((pcVar5 != (char *)0x0) && (iVar3 = strcmp(pcVar5,s), iVar3 == 0)) break;
    lVar8 = lVar8 + 8;
  }
  return pcVar5;
}

Assistant:

char const *
cubeb_strings_intern(cubeb_strings * strings, char const * s)
{
  char const * is = NULL;

  if (!strings || !s) {
    return NULL;
  }

  is = cubeb_strings_lookup(strings, s);
  if (is) {
    return is;
  }

  return cubeb_strings_push(strings, s);
}